

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O3

void __thiscall cmTarget::CopyImportedCxxModulesProperties(cmTarget *this,cmTarget *tgt)

{
  string *prop_00;
  bool bVar1;
  int iVar2;
  cmValue cVar3;
  cmGlobalGenerator *pcVar4;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *pcVar5;
  long lVar6;
  string *prop;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string_view value;
  string configUpper;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configNames;
  string local_c8;
  pointer local_a8;
  undefined8 local_a0;
  string local_98;
  string *local_78;
  string *local_70;
  string local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  bVar1 = IsNormal(this);
  if (bVar1) {
    __assert_fail("!this->IsNormal()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmTarget.cxx"
                  ,0x70c,"void cmTarget::CopyImportedCxxModulesProperties(const cmTarget *)");
  }
  bVar1 = cmTargetInternals::IsImported
                    ((this->impl)._M_t.
                     super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                     .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl);
  if (!bVar1) {
    bVar1 = cmTargetInternals::IsImported
                      ((tgt->impl)._M_t.
                       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                       .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl);
    if (bVar1) {
      if (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_ == '\0') {
        iVar2 = __cxa_guard_acquire(&CopyImportedCxxModulesProperties(cmTarget_const*)::
                                     propertiesToCopy_abi_cxx11_);
        if (iVar2 != 0) {
          CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_[0].
          _M_dataplus._M_p =
               (pointer)&CopyImportedCxxModulesProperties(cmTarget_const*)::
                         propertiesToCopy_abi_cxx11_[0].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_,
                     "DEFINE_SYMBOL","");
          CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_[1].
          _M_dataplus._M_p =
               (pointer)&CopyImportedCxxModulesProperties(cmTarget_const*)::
                         propertiesToCopy_abi_cxx11_[1].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_
                     + 1),"DEPRECATION","");
          CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_[2].
          _M_dataplus._M_p =
               (pointer)&CopyImportedCxxModulesProperties(cmTarget_const*)::
                         propertiesToCopy_abi_cxx11_[2].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_
                     + 2),"NO_SYSTEM_FROM_IMPORTED","");
          CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_[3].
          _M_dataplus._M_p =
               (pointer)&CopyImportedCxxModulesProperties(cmTarget_const*)::
                         propertiesToCopy_abi_cxx11_[3].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_
                     + 3),"POSITION_INDEPENDENT_CODE","");
          CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_[4].
          _M_dataplus._M_p =
               (pointer)&CopyImportedCxxModulesProperties(cmTarget_const*)::
                         propertiesToCopy_abi_cxx11_[4].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_
                     + 4),"VISIBILITY_INLINES_HIDDEN","");
          CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_[5].
          _M_dataplus._M_p =
               (pointer)&CopyImportedCxxModulesProperties(cmTarget_const*)::
                         propertiesToCopy_abi_cxx11_[5].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_
                     + 5),"ANDROID_API","");
          CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_[6].
          _M_dataplus._M_p =
               (pointer)&CopyImportedCxxModulesProperties(cmTarget_const*)::
                         propertiesToCopy_abi_cxx11_[6].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_
                     + 6),"ANDROID_API_MIN","");
          CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_[7].
          _M_dataplus._M_p =
               (pointer)&CopyImportedCxxModulesProperties(cmTarget_const*)::
                         propertiesToCopy_abi_cxx11_[7].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_
                     + 7),"ANDROID_ARCH","");
          CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_[8].
          _M_dataplus._M_p =
               (pointer)&CopyImportedCxxModulesProperties(cmTarget_const*)::
                         propertiesToCopy_abi_cxx11_[8].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_
                     + 8),"ANDROID_STL_TYPE","");
          CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_[9].
          _M_dataplus._M_p =
               (pointer)&CopyImportedCxxModulesProperties(cmTarget_const*)::
                         propertiesToCopy_abi_cxx11_[9].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_
                     + 9),"OSX_ARCHITECTURES","");
          CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_[10].
          _M_dataplus._M_p =
               (pointer)&CopyImportedCxxModulesProperties(cmTarget_const*)::
                         propertiesToCopy_abi_cxx11_[10].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_
                     + 10),"MSVC_DEBUG_INFORMATION_FORMAT","");
          CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_[0xb].
          _M_dataplus._M_p =
               (pointer)&CopyImportedCxxModulesProperties(cmTarget_const*)::
                         propertiesToCopy_abi_cxx11_[0xb].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_
                     + 0xb),"MSVC_RUNTIME_LIBRARY","");
          CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_[0xc].
          _M_dataplus._M_p =
               (pointer)&CopyImportedCxxModulesProperties(cmTarget_const*)::
                         propertiesToCopy_abi_cxx11_[0xc].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_
                     + 0xc),"VS_PLATFORM_TOOLSET","");
          CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_[0xd].
          _M_dataplus._M_p =
               (pointer)&CopyImportedCxxModulesProperties(cmTarget_const*)::
                         propertiesToCopy_abi_cxx11_[0xd].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_
                     + 0xd),"WATCOM_RUNTIME_LIBRARY","");
          CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_[0xe].
          _M_dataplus._M_p =
               (pointer)&CopyImportedCxxModulesProperties(cmTarget_const*)::
                         propertiesToCopy_abi_cxx11_[0xe].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_
                     + 0xe),"CXX_COMPILER_LAUNCHER","");
          CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_[0xf].
          _M_dataplus._M_p =
               (pointer)&CopyImportedCxxModulesProperties(cmTarget_const*)::
                         propertiesToCopy_abi_cxx11_[0xf].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_
                     + 0xf),"CXX_STANDARD","");
          CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_[0x10].
          _M_dataplus._M_p =
               (pointer)&CopyImportedCxxModulesProperties(cmTarget_const*)::
                         propertiesToCopy_abi_cxx11_[0x10].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_
                     + 0x10),"CXX_STANDARD_REQUIRED","");
          CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_[0x11].
          _M_dataplus._M_p =
               (pointer)&CopyImportedCxxModulesProperties(cmTarget_const*)::
                         propertiesToCopy_abi_cxx11_[0x11].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_
                     + 0x11),"CXX_EXTENSIONS","");
          CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_[0x12].
          _M_dataplus._M_p =
               (pointer)&CopyImportedCxxModulesProperties(cmTarget_const*)::
                         propertiesToCopy_abi_cxx11_[0x12].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_
                     + 0x12),"CXX_VISIBILITY_PRESET","");
          CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_[0x13].
          _M_dataplus._M_p =
               (pointer)&CopyImportedCxxModulesProperties(cmTarget_const*)::
                         propertiesToCopy_abi_cxx11_[0x13].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_
                     + 0x13),"CXX_CLANG_TIDY","");
          CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_[0x14].
          _M_dataplus._M_p =
               (pointer)&CopyImportedCxxModulesProperties(cmTarget_const*)::
                         propertiesToCopy_abi_cxx11_[0x14].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_
                     + 0x14),"CXX_CLANG_TIDY_EXPORT_FIXES_DIR","");
          CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_[0x15].
          _M_dataplus._M_p =
               (pointer)&CopyImportedCxxModulesProperties(cmTarget_const*)::
                         propertiesToCopy_abi_cxx11_[0x15].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_
                     + 0x15),"CXX_CPPLINT","");
          CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_[0x16].
          _M_dataplus._M_p =
               (pointer)&CopyImportedCxxModulesProperties(cmTarget_const*)::
                         propertiesToCopy_abi_cxx11_[0x16].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_
                     + 0x16),"CXX_CPPCHECK","");
          CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_[0x17].
          _M_dataplus._M_p =
               (pointer)&CopyImportedCxxModulesProperties(cmTarget_const*)::
                         propertiesToCopy_abi_cxx11_[0x17].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_
                     + 0x17),"CXX_INCLUDE_WHAT_YOU_USE","");
          CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_[0x18].
          _M_dataplus._M_p =
               (pointer)&CopyImportedCxxModulesProperties(cmTarget_const*)::
                         propertiesToCopy_abi_cxx11_[0x18].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_
                     + 0x18),"EXCLUDE_FROM_ALL","");
          CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_[0x19].
          _M_dataplus._M_p =
               (pointer)&CopyImportedCxxModulesProperties(cmTarget_const*)::
                         propertiesToCopy_abi_cxx11_[0x19].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_
                     + 0x19),"EXCLUDE_FROM_DEFAULT_BUILD","");
          CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_[0x1a].
          _M_dataplus._M_p =
               (pointer)&CopyImportedCxxModulesProperties(cmTarget_const*)::
                         propertiesToCopy_abi_cxx11_[0x1a].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_
                     + 0x1a),"OPTIMIZE_DEPENDENCIES","");
          CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_[0x1b].
          _M_dataplus._M_p =
               (pointer)&CopyImportedCxxModulesProperties(cmTarget_const*)::
                         propertiesToCopy_abi_cxx11_[0x1b].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_
                     + 0x1b),"JOB_POOL_COMPILE","");
          CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_[0x1c].
          _M_dataplus._M_p =
               (pointer)&CopyImportedCxxModulesProperties(cmTarget_const*)::
                         propertiesToCopy_abi_cxx11_[0x1c].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_
                     + 0x1c),"VS_NO_COMPILE_BATCHING","");
          CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_[0x1d].
          _M_dataplus._M_p =
               (pointer)&CopyImportedCxxModulesProperties(cmTarget_const*)::
                         propertiesToCopy_abi_cxx11_[0x1d].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_
                     + 0x1d),"VS_PROJECT_IMPORT","");
          CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_[0x1e].
          _M_dataplus._M_p =
               (pointer)&CopyImportedCxxModulesProperties(cmTarget_const*)::
                         propertiesToCopy_abi_cxx11_[0x1e].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_
                     + 0x1e),"EchoString","");
          CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_[0x1f].
          _M_dataplus._M_p =
               (pointer)&CopyImportedCxxModulesProperties(cmTarget_const*)::
                         propertiesToCopy_abi_cxx11_[0x1f].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_
                     + 0x1f),"EXPORT_COMPILE_COMMANDS","");
          CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_[0x20].
          _M_dataplus._M_p =
               (pointer)&CopyImportedCxxModulesProperties(cmTarget_const*)::
                         propertiesToCopy_abi_cxx11_[0x20].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_
                     + 0x20),"FOLDER","");
          CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_[0x21].
          _M_dataplus._M_p =
               (pointer)&CopyImportedCxxModulesProperties(cmTarget_const*)::
                         propertiesToCopy_abi_cxx11_[0x21].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_
                     + 0x21),"LABELS","");
          CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_[0x22].
          _M_dataplus._M_p =
               (pointer)&CopyImportedCxxModulesProperties(cmTarget_const*)::
                         propertiesToCopy_abi_cxx11_[0x22].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_
                     + 0x22),"PROJECT_LABEL","");
          CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_[0x23].
          _M_dataplus._M_p =
               (pointer)&CopyImportedCxxModulesProperties(cmTarget_const*)::
                         propertiesToCopy_abi_cxx11_[0x23].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     (CopyImportedCxxModulesProperties(cmTarget_const*)::propertiesToCopy_abi_cxx11_
                     + 0x23),"SYSTEM","");
          __cxa_atexit(__cxx_global_array_dtor,0,&__dso_handle);
          __cxa_guard_release(&CopyImportedCxxModulesProperties(cmTarget_const*)::
                               propertiesToCopy_abi_cxx11_);
        }
      }
      lVar6 = 0;
      do {
        prop_00 = (string *)
                  ((long)&CopyImportedCxxModulesProperties(cmTarget_const*)::
                          propertiesToCopy_abi_cxx11_[0]._M_dataplus._M_p + lVar6);
        cVar3 = GetProperty(tgt,prop_00);
        SetProperty(this,prop_00,cVar3);
        lVar6 = lVar6 + 0x20;
      } while (lVar6 != 0x480);
      if (CopyImportedCxxModulesProperties(cmTarget_const*)::perConfigPropertiesToCopy == '\0') {
        CopyImportedCxxModulesProperties();
      }
      cmMakefile::GetGeneratorConfigs_abi_cxx11_
                (&local_48,
                 ((this->impl)._M_t.
                  super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                  .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile,
                 ExcludeEmptyConfig);
      local_78 = local_48.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      if (local_48.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_48.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        do {
          local_70 = local_48.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          cmsys::SystemTools::UpperCase
                    (&local_98,
                     local_48.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start);
          lVar6 = 0;
          do {
            local_c8._M_dataplus._M_p =
                 *(pointer *)
                  ((long)&CopyImportedCxxModulesProperties::perConfigPropertiesToCopy[0].
                          super_string_view._M_len + lVar6);
            local_c8._M_string_length =
                 *(size_type *)
                  ((long)&CopyImportedCxxModulesProperties::perConfigPropertiesToCopy[0].
                          super_string_view._M_str + lVar6);
            local_c8.field_2._M_allocated_capacity = 0;
            local_c8.field_2._8_8_ = local_98._M_string_length;
            local_a8 = local_98._M_dataplus._M_p;
            local_a0 = 0;
            views._M_len = 2;
            views._M_array = (iterator)&local_c8;
            cmCatViews(&local_68,views);
            cVar3 = GetProperty(tgt,&local_68);
            SetProperty(this,&local_68,cVar3);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p != &local_68.field_2) {
              operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
            }
            lVar6 = lVar6 + 0x10;
          } while (lVar6 != 0x40);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          }
          local_48.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = local_70 + 1;
        } while (local_48.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start != local_78);
      }
      pcVar4 = cmMakefile::GetGlobalGenerator
                         (((this->impl)._M_t.
                           super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                           .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                          Makefile);
      iVar2 = (*pcVar4->_vptr_cmGlobalGenerator[0x29])(pcVar4);
      if ((char)iVar2 != '\0') {
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_c8,"XCODE_GENERATE_SCHEME","");
        cVar3 = GetProperty(tgt,&local_c8);
        SetProperty(this,&local_c8,cVar3);
        pcVar5 = extraout_RDX;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
          pcVar5 = extraout_RDX_00;
        }
        if (cVar3.Value != (string *)0x0) {
          value._M_str = pcVar5;
          value._M_len = (size_t)((cVar3.Value)->_M_dataplus)._M_p;
          cmValue::IsOn((cmValue *)(cVar3.Value)->_M_string_length,value);
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_48);
      return;
    }
    __assert_fail("tgt->IsImported()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmTarget.cxx"
                  ,0x710,"void cmTarget::CopyImportedCxxModulesProperties(const cmTarget *)");
  }
  __assert_fail("!this->IsImported()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmTarget.cxx"
                ,0x70e,"void cmTarget::CopyImportedCxxModulesProperties(const cmTarget *)");
}

Assistant:

void cmTarget::CopyImportedCxxModulesProperties(cmTarget const* tgt)
{
  // Normal targets cannot be the target of a copy.
  assert(!this->IsNormal());
  // Imported targets cannot be the target of a copy.
  assert(!this->IsImported());
  // Only imported targets can be the source of a copy.
  assert(tgt->IsImported());

  // The list of properties that are relevant here include:
  // - compilation-specific properties for any language or platform
  // - compilation-specific properties for C++
  // - build graph-specific properties that affect compilation
  // - IDE metadata properties
  // - static analysis properties

  static const std::string propertiesToCopy[] = {
    // Compilation properties
    "DEFINE_SYMBOL",
    "DEPRECATION",
    "NO_SYSTEM_FROM_IMPORTED",
    "POSITION_INDEPENDENT_CODE",
    "VISIBILITY_INLINES_HIDDEN",
    // -- Platforms
    // ---- Android
    "ANDROID_API",
    "ANDROID_API_MIN",
    "ANDROID_ARCH",
    "ANDROID_STL_TYPE",
    // ---- macOS
    "OSX_ARCHITECTURES",
    // ---- Windows
    "MSVC_DEBUG_INFORMATION_FORMAT",
    "MSVC_RUNTIME_LIBRARY",
    "VS_PLATFORM_TOOLSET",
    // ---- OpenWatcom
    "WATCOM_RUNTIME_LIBRARY",
    // -- Language
    // ---- C++
    "CXX_COMPILER_LAUNCHER",
    "CXX_STANDARD",
    "CXX_STANDARD_REQUIRED",
    "CXX_EXTENSIONS",
    "CXX_VISIBILITY_PRESET",

    // Static analysis
    "CXX_CLANG_TIDY",
    "CXX_CLANG_TIDY_EXPORT_FIXES_DIR",
    "CXX_CPPLINT",
    "CXX_CPPCHECK",
    "CXX_INCLUDE_WHAT_YOU_USE",

    // Build graph properties
    "EXCLUDE_FROM_ALL",
    "EXCLUDE_FROM_DEFAULT_BUILD",
    "OPTIMIZE_DEPENDENCIES",
    // -- Ninja
    "JOB_POOL_COMPILE",
    // -- Visual Studio
    "VS_NO_COMPILE_BATCHING",
    "VS_PROJECT_IMPORT",

    // Metadata
    "EchoString",
    "EXPORT_COMPILE_COMMANDS",
    "FOLDER",
    "LABELS",
    "PROJECT_LABEL",
    "SYSTEM",
  };

  auto copyProperty = [this, tgt](std::string const& prop) -> cmValue {
    cmValue value = tgt->GetProperty(prop);
    // Always set the property; it may have been explicitly unset.
    this->SetProperty(prop, value);
    return value;
  };

  for (auto const& prop : propertiesToCopy) {
    copyProperty(prop);
  }

  static const cm::static_string_view perConfigPropertiesToCopy[] = {
    "EXCLUDE_FROM_DEFAULT_BUILD_"_s,
    "IMPORTED_CXX_MODULES_"_s,
    "MAP_IMPORTED_CONFIG_"_s,
    "OSX_ARCHITECTURES_"_s,
  };

  std::vector<std::string> configNames =
    this->impl->Makefile->GetGeneratorConfigs(cmMakefile::ExcludeEmptyConfig);
  for (std::string const& configName : configNames) {
    std::string configUpper = cmSystemTools::UpperCase(configName);
    for (auto const& perConfigProp : perConfigPropertiesToCopy) {
      copyProperty(cmStrCat(perConfigProp, configUpper));
    }
  }

  if (this->GetGlobalGenerator()->IsXcode()) {
    cmValue xcodeGenerateScheme = copyProperty("XCODE_GENERATE_SCHEME");

    // TODO: Make sure these show up on the imported target in the first place
    // XCODE_ATTRIBUTE_???

    if (xcodeGenerateScheme.IsOn()) {
#ifdef __APPLE__
      static const std::string xcodeSchemePropertiesToCopy[] = {
        // FIXME: Do all of these apply? Do they matter?
        "XCODE_SCHEME_ADDRESS_SANITIZER",
        "XCODE_SCHEME_ADDRESS_SANITIZER_USE_AFTER_RETURN",
        "XCODE_SCHEME_DISABLE_MAIN_THREAD_CHECKER",
        "XCODE_SCHEME_DYNAMIC_LIBRARY_LOADS",
        "XCODE_SCHEME_DYNAMIC_LINKER_API_USAGE",
        "XCODE_SCHEME_ENABLE_GPU_API_VALIDATION",
        "XCODE_SCHEME_ENABLE_GPU_SHADER_VALIDATION",
        "XCODE_SCHEME_GUARD_MALLOC",
        "XCODE_SCHEME_LAUNCH_CONFIGURATION",
        "XCODE_SCHEME_MAIN_THREAD_CHECKER_STOP",
        "XCODE_SCHEME_MALLOC_GUARD_EDGES",
        "XCODE_SCHEME_MALLOC_SCRIBBLE",
        "XCODE_SCHEME_MALLOC_STACK",
        "XCODE_SCHEME_THREAD_SANITIZER",
        "XCODE_SCHEME_THREAD_SANITIZER_STOP",
        "XCODE_SCHEME_UNDEFINED_BEHAVIOUR_SANITIZER",
        "XCODE_SCHEME_UNDEFINED_BEHAVIOUR_SANITIZER_STOP",
        "XCODE_SCHEME_ZOMBIE_OBJECTS",
      };

      for (auto const& xcodeProperty : xcodeSchemePropertiesToCopy) {
        copyProperty(xcodeProperty);
      }
#endif
    }
  }
}